

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack24_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x18;
  *puVar1 = (in[1] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x10;
  *puVar1 = (in[2] & 0xff) << 0x10 | *puVar1;
  out[3] = in[2] >> 8;
  out[4] = in[3] & 0xffffff;
  puVar1 = out + 5;
  *puVar1 = in[3] >> 0x18;
  *puVar1 = (in[4] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[4] >> 0x10;
  *puVar1 = (in[5] & 0xff) << 0x10 | *puVar1;
  out[7] = in[5] >> 8;
  out[8] = in[6] & 0xffffff;
  puVar1 = out + 9;
  *puVar1 = in[6] >> 0x18;
  *puVar1 = (in[7] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[7] >> 0x10;
  *puVar1 = (in[8] & 0xff) << 0x10 | *puVar1;
  out[0xb] = in[8] >> 8;
  out[0xc] = in[9] & 0xffffff;
  puVar1 = out + 0xd;
  *puVar1 = in[9] >> 0x18;
  *puVar1 = (in[10] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[10] >> 0x10;
  *puVar1 = (in[0xb] & 0xff) << 0x10 | *puVar1;
  out[0xf] = in[0xb] >> 8;
  out[0x10] = in[0xc] & 0xffffff;
  puVar1 = out + 0x11;
  *puVar1 = in[0xc] >> 0x18;
  *puVar1 = (in[0xd] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0xd] >> 0x10;
  *puVar1 = (in[0xe] & 0xff) << 0x10 | *puVar1;
  out[0x13] = in[0xe] >> 8;
  out[0x14] = in[0xf] & 0xffffff;
  puVar1 = out + 0x15;
  *puVar1 = in[0xf] >> 0x18;
  *puVar1 = (in[0x10] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0x10] >> 0x10;
  *puVar1 = (in[0x11] & 0xff) << 0x10 | *puVar1;
  out[0x17] = in[0x11] >> 8;
  out[0x18] = in[0x12] & 0xffffff;
  puVar1 = out + 0x19;
  *puVar1 = in[0x12] >> 0x18;
  *puVar1 = (in[0x13] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = in[0x13] >> 0x10;
  *puVar1 = (in[0x14] & 0xff) << 0x10 | *puVar1;
  out[0x1b] = in[0x14] >> 8;
  out[0x1c] = in[0x15] & 0xffffff;
  puVar1 = out + 0x1d;
  *puVar1 = in[0x15] >> 0x18;
  *puVar1 = (in[0x16] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = in[0x16] >> 0x10;
  *puVar1 = (in[0x17] & 0xff) << 0x10 | *puVar1;
  out[0x1f] = in[0x17] >> 8;
  return in + 0x18;
}

Assistant:

const uint32_t *__fastunpack24_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;

  return in;
}